

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.h
# Opt level: O3

string * __thiscall Proxy::ToString_abi_cxx11_(string *__return_storage_ptr__,Proxy *this)

{
  long lVar1;
  pointer pcVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_is_unix_socket == true) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (this->m_unix_socket_path)._M_dataplus._M_p;
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
LAB_0087ae2a:
      __stack_chk_fail();
    }
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,
               pcVar2 + (this->m_unix_socket_path)._M_string_length);
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_0087ae2a;
    CService::ToStringAddrPort_abi_cxx11_(__return_storage_ptr__,&this->proxy);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const
    {
        if (m_is_unix_socket) return m_unix_socket_path;
        return proxy.ToStringAddrPort();
    }